

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::GetUtf8Suffix_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field,Options *options)

{
  Utf8CheckMode UVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  UVar1 = GetUtf8CheckMode((FieldDescriptor *)this,(Options *)field);
  if (UVar1 == VERIFY) {
    pcVar3 = "UTF8Verify";
    paVar2 = &local_a;
  }
  else if (UVar1 == STRICT) {
    pcVar3 = "UTF8";
    paVar2 = &local_9;
  }
  else {
    pcVar3 = "";
    paVar2 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GetUtf8Suffix(const FieldDescriptor* field,
                          const Options& options) {
  switch (GetUtf8CheckMode(field, options)) {
    case STRICT:
      return "UTF8";
    case VERIFY:
      return "UTF8Verify";
    case NONE:
    default:  // Some build configs warn on missing return without default.
      return "";
  }
}